

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

bool __thiscall
OpenMesh::PolyConnectivity::is_collapse_ok(PolyConnectivity *this,HalfedgeHandle v0v1)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  value_type vVar3;
  HalfedgeHandle HVar4;
  FaceHandle FVar5;
  BaseHandle BVar6;
  uint uVar7;
  StatusInfo *pSVar8;
  undefined4 uVar9;
  BaseHandle BVar10;
  undefined8 unaff_R12;
  HalfedgeHandle HVar11;
  byte bVar12;
  undefined8 unaff_R15;
  ulong uVar13;
  VertexVertexIter local_80;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  local_68;
  BaseHandle local_4c;
  BaseHandle local_48;
  BaseHandle local_44;
  BaseHandle local_40;
  uint local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,
                               (EdgeHandle)((int)v0v1.super_BaseHandle.idx_ >> 1));
  if ((pSVar8->status_ & 1) == 0) {
    HVar11.super_BaseHandle.idx_ =
         (BaseHandle)
         ((-((uint)v0v1.super_BaseHandle.idx_ & 1) | 1) + (int)v0v1.super_BaseHandle.idx_);
    local_38.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar11);
    local_44.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,v0v1);
    bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,v0v1);
    if (bVar1) {
      uVar9 = 0;
    }
    else {
      FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,v0v1);
      uVar7 = valence(this,FVar5);
      uVar9 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),uVar7 == 3);
    }
    bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,HVar11);
    if (bVar1) {
      uVar13 = 0;
    }
    else {
      FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar11);
      uVar7 = valence(this,FVar5);
      uVar13 = CONCAT71((int7)((ulong)unaff_R15 >> 8),uVar7 == 3);
    }
    HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
    local_4c.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar2);
    HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar11);
    local_48.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,HVar2);
    pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_38.idx_);
    if (((pSVar8->status_ & 1) == 0) &&
       (pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,(VertexHandle)local_44.idx_),
       (pSVar8->status_ & 1) == 0)) {
      bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,v0v1);
      local_3c = (uint)uVar13;
      if ((char)uVar9 == '\x01' && !bVar1) {
        HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
        local_40.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar2);
        uVar13 = (ulong)local_3c;
        bVar1 = ArrayKernel::is_boundary
                          (&this->super_ArrayKernel,
                           (HalfedgeHandle)
                           ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) +
                           (int)HVar2.super_BaseHandle.idx_));
        if ((bVar1) &&
           (bVar1 = ArrayKernel::is_boundary
                              (&this->super_ArrayKernel,
                               (HalfedgeHandle)((-(local_40.idx_ & 1U) | 1) + local_40.idx_)), bVar1
           )) {
          return false;
        }
      }
      bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,HVar11);
      local_40.idx_ = CONCAT31(local_40.idx_._1_3_,(char)uVar13) ^ 1;
      if (!bVar1 && (char)uVar13 == '\x01') {
        HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar11);
        local_34.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar2);
        bVar1 = ArrayKernel::is_boundary
                          (&this->super_ArrayKernel,
                           (HalfedgeHandle)
                           ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) +
                           (int)HVar2.super_BaseHandle.idx_));
        if ((bVar1) &&
           (bVar1 = ArrayKernel::is_boundary
                              (&this->super_ArrayKernel,
                               (HalfedgeHandle)((-(local_34.idx_ & 1U) | 1) + local_34.idx_)), bVar1
           )) {
          return false;
        }
      }
      bVar1 = is_boundary(this,(VertexHandle)local_38.idx_);
      if ((((!bVar1) || (bVar1 = is_boundary(this,(VertexHandle)local_44.idx_), !bVar1)) ||
          (bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,v0v1), bVar1)) ||
         (bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,HVar11), bVar1)) {
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0xffffffff;
        local_34.idx_ = uVar9;
        vv_iter(&local_80,this,(VertexHandle)local_38.idx_);
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_68);
          pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,
                                       (VertexHandle)vVar3.super_BaseHandle.idx_);
          *(byte *)&pSVar8->status_ = (byte)pSVar8->status_ & 0xdf;
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_68);
        }
        vv_iter(&local_80,this,(VertexHandle)local_44.idx_);
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_68);
          pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,
                                       (VertexHandle)vVar3.super_BaseHandle.idx_);
          *(byte *)&pSVar8->status_ = (byte)pSVar8->status_ | 0x20;
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_68);
        }
        vv_iter(&local_80,this,(VertexHandle)local_38.idx_);
        BVar10.idx_ = local_34.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_80.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_68.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_68);
          pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,
                                       (VertexHandle)vVar3.super_BaseHandle.idx_);
          if (((pSVar8->status_ & 0x20) != 0) &&
             (vVar3 = Iterators::
                      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      ::operator*(&local_68),
             ((byte)BVar10.idx_ & vVar3.super_BaseHandle.idx_ == (BaseHandle)local_4c.idx_) == 0)) {
            vVar3 = Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*(&local_68);
            if (vVar3.super_BaseHandle.idx_ != (BaseHandle)local_48.idx_ ||
                (char)local_40.idx_ != '\0') {
              return false;
            }
          }
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_68);
        }
        if ((byte)BVar10.idx_ != 0) {
          HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,v0v1);
          HVar4 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar2);
          HVar2.super_BaseHandle.idx_ =
               (BaseHandle)
               ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) + (int)HVar2.super_BaseHandle.idx_);
          FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar2);
          BVar10.idx_ = local_34.idx_;
          BVar6.idx_ = (int)ArrayKernel::face_handle
                                      (&this->super_ArrayKernel,
                                       (HalfedgeHandle)
                                       ((-((uint)HVar4.super_BaseHandle.idx_ & 1) | 1) +
                                       (int)HVar4.super_BaseHandle.idx_));
          if (FVar5.super_BaseHandle.idx_ == (BaseHandle)BVar6.idx_) {
            FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar2);
            uVar7 = valence(this,FVar5);
            if (uVar7 != 3) {
              return false;
            }
          }
        }
        bVar12 = (byte)local_3c;
        if (bVar12 != 0) {
          HVar11 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar11);
          HVar2 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,HVar11);
          HVar11.super_BaseHandle.idx_ =
               (BaseHandle)
               ((-((uint)HVar11.super_BaseHandle.idx_ & 1) | 1) + (int)HVar11.super_BaseHandle.idx_)
          ;
          FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar11);
          bVar12 = (byte)local_3c;
          BVar6.idx_ = (int)ArrayKernel::face_handle
                                      (&this->super_ArrayKernel,
                                       (HalfedgeHandle)
                                       ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) +
                                       (int)HVar2.super_BaseHandle.idx_));
          BVar10.idx_ = local_34.idx_;
          if (FVar5.super_BaseHandle.idx_ == (BaseHandle)BVar6.idx_) {
            FVar5 = ArrayKernel::face_handle(&this->super_ArrayKernel,HVar11);
            uVar7 = valence(this,FVar5);
            if (uVar7 != 3) {
              return false;
            }
          }
        }
        vVar3 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator*(&local_68);
        pSVar8 = ArrayKernel::status(&this->super_ArrayKernel,
                                     (VertexHandle)vVar3.super_BaseHandle.idx_);
        if (((pSVar8->status_ & 0x20) == 0) ||
           ((byte)((byte)BVar10.idx_ & bVar12 & local_4c.idx_ == local_48.idx_) == 0)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PolyConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  //is edge already deleteed?
  if (status(edge_handle(v0v1)).deleted())
  {
    return false;
  }

  HalfedgeHandle v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle v0(to_vertex_handle(v1v0));
  VertexHandle v1(to_vertex_handle(v0v1));  

  bool v0v1_triangle = false;
  bool v1v0_triangle = false;
  
  if (!is_boundary(v0v1))
    v0v1_triangle = valence(face_handle(v0v1)) == 3;
  
  if (!is_boundary(v1v0))
    v1v0_triangle = valence(face_handle(v1v0)) == 3;

  //in a quadmesh we dont have the "next" or "previous" vhandle, so we need to look at previous and next on both sides
  //VertexHandle v_01_p = from_vertex_handle(prev_halfedge_handle(v0v1));
  VertexHandle v_01_n = to_vertex_handle(next_halfedge_handle(v0v1));  

  //VertexHandle v_10_p = from_vertex_handle(prev_halfedge_handle(v1v0));
  VertexHandle v_10_n = to_vertex_handle(next_halfedge_handle(v1v0));

  //are the vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
  {
    return false;
  }

  //the edges v1-vl and vl-v0 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v0v1))
  {
    if (v0v1_triangle)
    {
      //VertexHandle vl = to_vertex_handle(next_halfedge_handle(v0v1));

      HalfedgeHandle h1 = next_halfedge_handle(v0v1);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  //the edges v0-vr and vr-v1 must not be both boundary edges
  //this test makes only sense in a polymesh if the side face is a triangle
  if (!is_boundary(v1v0))
  {
    if (v1v0_triangle)
    {
      //VertexHandle vr = to_vertex_handle(next_halfedge_handle(v1v0));

      HalfedgeHandle h1 = next_halfedge_handle(v1v0);
      HalfedgeHandle h2 = next_halfedge_handle(h1);
      if (is_boundary(opposite_halfedge_handle(h1)) && is_boundary(opposite_halfedge_handle(h2)))
        return false;
    }
  }

  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) && !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;
  
  VertexVertexIter vv_it;
  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(false);
  }

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
  {
    status(*vv_it).set_tagged(true);
  }

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
  {
    if (status(*vv_it).tagged() &&
      !(*vv_it == v_01_n && v0v1_triangle) &&
      !(*vv_it == v_10_n && v1v0_triangle)
      )
    {
      return false;
    }
  }
  
  //test for a face on the backside/other side that might degenerate
  if (v0v1_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v0v1);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }
  
  if (v1v0_triangle)
  {
    HalfedgeHandle one, two;
    one = next_halfedge_handle(v1v0);
    two = next_halfedge_handle(one);
    
    one = opposite_halfedge_handle(one);
    two = opposite_halfedge_handle(two);
    
    if (face_handle(one) == face_handle(two) && valence(face_handle(one)) != 3)
    {
      return false;
    }
  }

  if (status(*vv_it).tagged() && v_01_n == v_10_n && v0v1_triangle && v1v0_triangle)
  {
    return false;
  }

  // passed all tests
  return true;
}